

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void __thiscall
duckdb::WindowQuantileState<int>::UpdateSkip
          (WindowQuantileState<int> *this,CursorType *data,SubFrames *frames,IncludedType *included)

{
  bool bVar1;
  reference pvVar2;
  const_reference pvVar3;
  SkipListType *pSVar4;
  int *__y;
  HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_> *in_RCX
  ;
  SubFrames *in_RDX;
  CursorType *in_RSI;
  SkipListUpdater updater;
  SkipListType *skip_1;
  idx_t i;
  FrameBounds *frame;
  const_iterator __end3;
  const_iterator __begin3;
  SubFrames *__range3;
  SkipListType *skip;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *in_stack_ffffffffffffff58;
  SkipListType *in_stack_ffffffffffffff60;
  idx_t *in_stack_ffffffffffffff68;
  QuantileCursor<int> *in_stack_ffffffffffffff70;
  SkipListUpdater local_80;
  SkipListType *local_68;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffffa0;
  ulong local_50;
  reference local_48;
  FrameBounds *local_40;
  __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
  local_38 [2];
  SkipListType *value;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>_>
                      *)0x1d0885d);
  if (bVar1) {
    pvVar2 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff70 = (QuantileCursor<int> *)pvVar2->end;
    pvVar3 = vector<duckdb::FrameBounds,_true>::front
                       ((vector<duckdb::FrameBounds,_true> *)0x1d08887);
    if ((QuantileCursor<int> *)pvVar3->start < in_stack_ffffffffffffff70) {
      pvVar3 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffff68 = (idx_t *)pvVar3->end;
      pvVar2 = vector<duckdb::FrameBounds,_true>::front
                         ((vector<duckdb::FrameBounds,_true> *)0x1d088b8);
      if ((idx_t *)pvVar2->start < in_stack_ffffffffffffff68) {
        local_68 = GetSkipList((WindowQuantileState<int> *)in_stack_ffffffffffffff70,
                               SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
        SkipListUpdater::SkipListUpdater(&local_80,local_68,in_RSI,(IncludedType *)in_RCX);
        AggregateExecutor::IntersectFrames<duckdb::WindowQuantileState<int>::SkipListUpdater>
                  ((SubFrames *)in_RSI,in_RDX,(SkipListUpdater *)in_RCX);
        return;
      }
    }
  }
  pSVar4 = GetSkipList((WindowQuantileState<int> *)in_stack_ffffffffffffff70,
                       SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
  local_38[0]._M_current =
       (FrameBounds *)
       ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::begin
                 (in_stack_ffffffffffffff58);
  local_40 = (FrameBounds *)
             ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::end
                       (in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
               ::operator*(local_38);
    for (local_50 = local_48->start; local_50 < local_48->end; local_50 = local_50 + 1) {
      bVar1 = QuantileIncluded<int>::operator()
                        ((QuantileIncluded<int> *)in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68);
      if (bVar1) {
        value = pSVar4;
        __y = QuantileCursor<int>::operator[]
                        (in_stack_ffffffffffffff70,(idx_t)in_stack_ffffffffffffff68);
        ::std::pair<unsigned_long,_int>::pair<unsigned_long_&,_true>
                  ((pair<unsigned_long,_int> *)&stack0xffffffffffffffa0,&local_50,__y);
        duckdb_skiplistlib::skip_list::
        HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::
        insert(in_RCX,(pair<unsigned_long,_int> *)value);
        in_stack_ffffffffffffff60 = pSVar4;
        pSVar4 = value;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
    ::operator++(local_38);
  }
  return;
}

Assistant:

void UpdateSkip(CursorType &data, const SubFrames &frames, IncludedType &included) {
		//	No overlap, or no data
		if (!s || prevs.back().end <= frames.front().start || frames.back().end <= prevs.front().start) {
			auto &skip = GetSkipList(true);
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						skip.insert(SkipType(i, data[i]));
					}
				}
			}
		} else {
			auto &skip = GetSkipList();
			SkipListUpdater updater(skip, data, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}
	}